

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O1

void __thiscall slang::IntervalMapDetails::Path::moveLeft(Path *this,uint32_t level)

{
  size_type sVar1;
  pointer pEVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Entry local_28;
  
  sVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if ((sVar1 == 0) ||
     (pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar2->size <= pEVar2->offset)) {
    uVar6 = 0;
    if ((int)sVar1 - 1U < level) {
      local_28.node = (void *)0x0;
      local_28.size = 0;
      local_28.offset = 0;
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      resizeImpl<slang::IntervalMapDetails::Path::Entry>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this,(ulong)(level + 1),
                 &local_28);
    }
  }
  else {
    uVar6 = (ulong)level;
    do {
      uVar6 = (ulong)((int)uVar6 - 1);
    } while ((this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[uVar6]
             .offset == 0);
  }
  pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar5 = pEVar2[uVar6].offset - 1;
  pEVar2[uVar6].offset = uVar5;
  uVar3 = *(ulong *)((long)pEVar2[uVar6].node + (ulong)uVar5 * 8);
  uVar5 = (int)uVar6 + 1;
  uVar4 = uVar5;
  for (; uVar5 != level; uVar5 = uVar5 + 1) {
    uVar4 = (uint)uVar3 & 0x3f;
    pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pEVar2[uVar5].node = (void *)(uVar3 & 0xffffffffffffffc0);
    pEVar2[uVar5].size = uVar4 + 1;
    pEVar2[uVar5].offset = uVar4;
    uVar3 = *(ulong *)((long)(uVar3 & 0xffffffffffffffc0) + (ulong)uVar4 * 8);
    uVar4 = level;
  }
  uVar5 = (uint)uVar3 & 0x3f;
  pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  pEVar2[uVar4].node = (void *)(uVar3 & 0xffffffffffffffc0);
  pEVar2[uVar4].size = uVar5 + 1;
  pEVar2[uVar4].offset = uVar5;
  return;
}

Assistant:

void Path::moveLeft(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go left.
    uint32_t l = 0;
    if (valid()) {
        l = level - 1;
        while (path[l].offset == 0) {
            SLANG_ASSERT(l);
            --l;
        }
    }
    else if (height() < level) {
        path.resize(level + 1, Entry(nullptr, 0, 0));
    }

    --path[l].offset;

    // Get the rightmost node of the new subtree.
    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, nodeRef.size() - 1);
        nodeRef = nodeRef.childAt(nodeRef.size() - 1);
    }
    path[l] = Entry(nodeRef, nodeRef.size() - 1);
}